

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resampler.cc
# Opt level: O0

int __thiscall
webrtc::Resampler::Push
          (Resampler *this,int16_t *samplesIn,size_t lengthIn,int16_t *samplesOut,size_t maxLen,
          size_t *outLen)

{
  uint uVar1;
  int16_t *out;
  int16_t *piVar2;
  int32_t *piVar3;
  int16_t *local_120;
  size_t i_17;
  size_t i_16;
  size_t i_15;
  size_t i_14;
  size_t i_13;
  size_t i_12;
  size_t i_11;
  size_t i_10;
  size_t i_9;
  size_t i_8;
  size_t i_7;
  size_t i_6;
  size_t i_5;
  size_t i_4;
  size_t i_3;
  size_t i_2;
  int32_t *tmp_mem;
  int16_t *tmp_2;
  int16_t *tmp;
  size_t i_1;
  size_t actualOutLen_right;
  size_t actualOutLen_left;
  size_t i;
  int16_t *piStack_60;
  int res;
  int16_t *out_right;
  int16_t *out_left;
  int16_t *right;
  int16_t *left;
  size_t *outLen_local;
  size_t maxLen_local;
  int16_t *samplesOut_local;
  size_t lengthIn_local;
  int16_t *samplesIn_local;
  Resampler *this_local;
  
  left = (int16_t *)outLen;
  outLen_local = (size_t *)maxLen;
  maxLen_local = (size_t)samplesOut;
  samplesOut_local = (int16_t *)lengthIn;
  lengthIn_local = (size_t)samplesIn;
  samplesIn_local = (int16_t *)this;
  if (this->num_channels_ == 2) {
    right = (int16_t *)malloc(lengthIn & 0x7fffffffffffffff);
    out_left = (int16_t *)malloc((ulong)samplesOut_local & 0x7fffffffffffffff);
    out_right = (int16_t *)malloc((ulong)outLen_local & 0xfffffffffffffffe);
    piStack_60 = (int16_t *)malloc((ulong)outLen_local & 0xfffffffffffffffe);
    i._4_4_ = 0;
    for (actualOutLen_left = 0; actualOutLen_left < samplesOut_local;
        actualOutLen_left = actualOutLen_left + 2) {
      *(undefined2 *)((long)right + actualOutLen_left) =
           *(undefined2 *)(lengthIn_local + actualOutLen_left * 2);
      *(undefined2 *)((long)out_left + actualOutLen_left) =
           *(undefined2 *)(lengthIn_local + 2 + actualOutLen_left * 2);
    }
    samplesOut_local = (int16_t *)((ulong)samplesOut_local >> 1);
    actualOutLen_right = 0;
    i_1 = 0;
    uVar1 = Push(this->slave_left_,right,(size_t)samplesOut_local,out_right,(ulong)outLen_local >> 1
                 ,&actualOutLen_right);
    i._4_4_ = uVar1 | i._4_4_;
    uVar1 = Push(this->slave_right_,out_left,(size_t)samplesOut_local,piStack_60,
                 (ulong)outLen_local >> 1,&i_1);
    i._4_4_ = uVar1 | i._4_4_;
    if ((i._4_4_ == 0) && (actualOutLen_right == i_1)) {
      for (tmp = (int16_t *)0x0; tmp < actualOutLen_right; tmp = (int16_t *)((long)tmp + 1)) {
        *(int16_t *)(maxLen_local + (long)tmp * 4) = out_right[(long)tmp];
        *(int16_t *)(maxLen_local + 2 + (long)tmp * 4) = piStack_60[(long)tmp];
      }
      *(size_t *)left = actualOutLen_right << 1;
      free(right);
      free(out_left);
      free(out_right);
      free(piStack_60);
      this_local._4_4_ = 0;
    }
    else {
      free(right);
      free(out_left);
      free(out_right);
      free(piStack_60);
      this_local._4_4_ = -1;
    }
  }
  else {
    switch(this->my_mode_) {
    case kResamplerMode1To1:
      memcpy(samplesOut,samplesIn,lengthIn << 1);
      *(int16_t **)left = samplesOut_local;
    default:
      this_local._4_4_ = 0;
      break;
    case kResamplerMode1To2:
      if (maxLen < lengthIn << 1) {
        this_local._4_4_ = -1;
      }
      else {
        WebRtcSpl_UpsampleBy2(samplesIn,lengthIn,samplesOut,(int32_t *)this->state1_);
        *(long *)left = (long)samplesOut_local << 1;
        this_local._4_4_ = 0;
      }
      break;
    case kResamplerMode1To3:
      if (lengthIn % 0xa0 == 0) {
        if (maxLen < lengthIn * 3) {
          this_local._4_4_ = -1;
        }
        else {
          piVar3 = (int32_t *)malloc(0x540);
          for (i_3 = 0; i_3 < samplesOut_local; i_3 = i_3 + 0xa0) {
            WebRtcSpl_Resample16khzTo48khz
                      ((int16_t *)(lengthIn_local + i_3 * 2),(int16_t *)(maxLen_local + i_3 * 6),
                       (WebRtcSpl_State16khzTo48khz *)this->state1_,piVar3);
          }
          *(long *)left = (long)samplesOut_local * 3;
          free(piVar3);
          this_local._4_4_ = 0;
        }
      }
      else {
        this_local._4_4_ = -1;
      }
      break;
    case kResamplerMode1To4:
      if (maxLen < lengthIn << 2) {
        this_local._4_4_ = -1;
      }
      else {
        piVar2 = (int16_t *)malloc(lengthIn << 2);
        WebRtcSpl_UpsampleBy2
                  ((int16_t *)lengthIn_local,(size_t)samplesOut_local,piVar2,
                   (int32_t *)this->state1_);
        WebRtcSpl_UpsampleBy2
                  (piVar2,(long)samplesOut_local << 1,(int16_t *)maxLen_local,
                   (int32_t *)this->state2_);
        *(long *)left = (long)samplesOut_local << 2;
        free(piVar2);
        this_local._4_4_ = 0;
      }
      break;
    case kResamplerMode1To6:
      if (lengthIn % 0x50 == 0) {
        if (maxLen < lengthIn * 6) {
          this_local._4_4_ = -1;
        }
        else {
          piVar3 = (int32_t *)malloc(0x540);
          piVar2 = (int16_t *)malloc((long)samplesOut_local << 2);
          WebRtcSpl_UpsampleBy2
                    ((int16_t *)lengthIn_local,(size_t)samplesOut_local,piVar2,
                     (int32_t *)this->state1_);
          *(long *)left = (long)samplesOut_local << 1;
          for (i_4 = 0; i_4 < *(ulong *)left; i_4 = i_4 + 0xa0) {
            WebRtcSpl_Resample16khzTo48khz
                      (piVar2 + i_4,(int16_t *)(maxLen_local + i_4 * 6),
                       (WebRtcSpl_State16khzTo48khz *)this->state2_,piVar3);
          }
          *(long *)left = *(long *)left * 3;
          free(piVar3);
          free(piVar2);
          this_local._4_4_ = 0;
        }
      }
      else {
        this_local._4_4_ = -1;
      }
      break;
    case kResamplerMode1To12:
      if (lengthIn % 0x28 == 0) {
        if (maxLen < lengthIn * 0xc) {
          this_local._4_4_ = -1;
        }
        else {
          piVar3 = (int32_t *)malloc(0x540);
          piVar2 = (int16_t *)malloc((long)samplesOut_local << 3);
          WebRtcSpl_UpsampleBy2
                    ((int16_t *)lengthIn_local,(size_t)samplesOut_local,(int16_t *)maxLen_local,
                     (int32_t *)this->state1_);
          *(long *)left = (long)samplesOut_local << 1;
          WebRtcSpl_UpsampleBy2
                    ((int16_t *)maxLen_local,*(size_t *)left,piVar2,(int32_t *)this->state2_);
          *(long *)left = *(long *)left << 1;
          for (i_5 = 0; i_5 < *(ulong *)left; i_5 = i_5 + 0xa0) {
            WebRtcSpl_Resample16khzTo48khz
                      (piVar2 + i_5,(int16_t *)(maxLen_local + i_5 * 6),
                       (WebRtcSpl_State16khzTo48khz *)this->state3_,piVar3);
          }
          *(long *)left = *(long *)left * 3;
          free(piVar3);
          free(piVar2);
          this_local._4_4_ = 0;
        }
      }
      else {
        this_local._4_4_ = -1;
      }
      break;
    case kResamplerMode2To3:
      if (maxLen < lengthIn * 3 >> 1) {
        this_local._4_4_ = -1;
      }
      else if (lengthIn % 0xa0 == 0) {
        piVar2 = (int16_t *)malloc(lengthIn * 6);
        piVar3 = (int32_t *)malloc(0x540);
        for (i_6 = 0; i_6 < samplesOut_local; i_6 = i_6 + 0xa0) {
          WebRtcSpl_Resample16khzTo48khz
                    ((int16_t *)(lengthIn_local + i_6 * 2),piVar2 + i_6 * 3,
                     (WebRtcSpl_State16khzTo48khz *)this->state1_,piVar3);
        }
        samplesOut_local = (int16_t *)((long)samplesOut_local * 3);
        WebRtcSpl_DownsampleBy2
                  (piVar2,(size_t)samplesOut_local,(int16_t *)maxLen_local,(int32_t *)this->state2_)
        ;
        *(ulong *)left = (ulong)samplesOut_local >> 1;
        free(piVar2);
        free(piVar3);
        this_local._4_4_ = 0;
      }
      else {
        this_local._4_4_ = -1;
      }
      break;
    case kResamplerMode2To11:
      if (lengthIn % 0x50 == 0) {
        if (maxLen < lengthIn * 0xb >> 1) {
          this_local._4_4_ = -1;
        }
        else {
          piVar2 = (int16_t *)malloc(lengthIn << 2);
          WebRtcSpl_UpsampleBy2
                    ((int16_t *)lengthIn_local,(size_t)samplesOut_local,piVar2,
                     (int32_t *)this->state1_);
          samplesOut_local = (int16_t *)((long)samplesOut_local << 1);
          piVar3 = (int32_t *)malloc(0x188);
          for (i_7 = 0; i_7 < samplesOut_local; i_7 = i_7 + 0x50) {
            WebRtcSpl_Resample8khzTo22khz
                      (piVar2 + i_7,(int16_t *)(maxLen_local + (i_7 * 0xb >> 2) * 2),
                       (WebRtcSpl_State8khzTo22khz *)this->state2_,piVar3);
          }
          *(ulong *)left = (ulong)((long)samplesOut_local * 0xb) >> 2;
          free(piVar3);
          free(piVar2);
          this_local._4_4_ = 0;
        }
      }
      else {
        this_local._4_4_ = -1;
      }
      break;
    case kResamplerMode4To11:
      if (lengthIn % 0x50 == 0) {
        if (maxLen < lengthIn * 0xb >> 2) {
          this_local._4_4_ = -1;
        }
        else {
          piVar3 = (int32_t *)malloc(0x188);
          for (i_8 = 0; i_8 < samplesOut_local; i_8 = i_8 + 0x50) {
            WebRtcSpl_Resample8khzTo22khz
                      ((int16_t *)(lengthIn_local + i_8 * 2),
                       (int16_t *)(maxLen_local + (i_8 * 0xb >> 2) * 2),
                       (WebRtcSpl_State8khzTo22khz *)this->state1_,piVar3);
          }
          *(ulong *)left = (ulong)((long)samplesOut_local * 0xb) >> 2;
          free(piVar3);
          this_local._4_4_ = 0;
        }
      }
      else {
        this_local._4_4_ = -1;
      }
      break;
    case kResamplerMode8To11:
      if (lengthIn % 0xa0 == 0) {
        if (maxLen < lengthIn * 0xb >> 3) {
          this_local._4_4_ = -1;
        }
        else {
          piVar3 = (int32_t *)malloc(0x160);
          for (i_9 = 0; i_9 < samplesOut_local; i_9 = i_9 + 0xa0) {
            WebRtcSpl_Resample16khzTo22khz
                      ((int16_t *)(lengthIn_local + i_9 * 2),
                       (int16_t *)(maxLen_local + (i_9 * 0xb >> 3) * 2),
                       (WebRtcSpl_State16khzTo22khz *)this->state1_,piVar3);
          }
          *(ulong *)left = (ulong)((long)samplesOut_local * 0xb) >> 3;
          free(piVar3);
          this_local._4_4_ = 0;
        }
      }
      else {
        this_local._4_4_ = -1;
      }
      break;
    case kResamplerMode11To16:
      if (lengthIn % 0x6e == 0) {
        if (maxLen < (lengthIn << 4) / 0xb) {
          this_local._4_4_ = -1;
        }
        else {
          piVar3 = (int32_t *)malloc(0x1a0);
          piVar2 = (int16_t *)malloc((long)samplesOut_local << 2);
          WebRtcSpl_UpsampleBy2
                    ((int16_t *)lengthIn_local,(size_t)samplesOut_local,piVar2,
                     (int32_t *)this->state1_);
          for (i_10 = 0; i_10 < (ulong)((long)samplesOut_local << 1); i_10 = i_10 + 0xdc) {
            WebRtcSpl_Resample22khzTo16khz
                      (piVar2 + i_10,(int16_t *)(maxLen_local + (i_10 / 0xdc) * 0x140),
                       (WebRtcSpl_State22khzTo16khz *)this->state2_,piVar3);
          }
          *(ulong *)left = (ulong)((long)samplesOut_local << 4) / 0xb;
          free(piVar3);
          free(piVar2);
          this_local._4_4_ = 0;
        }
      }
      else {
        this_local._4_4_ = -1;
      }
      break;
    case kResamplerMode11To32:
      if (lengthIn % 0x6e == 0) {
        if (maxLen < (lengthIn << 5) / 0xb) {
          this_local._4_4_ = -1;
        }
        else {
          piVar3 = (int32_t *)malloc(0x1a0);
          piVar2 = (int16_t *)malloc((long)samplesOut_local << 2);
          WebRtcSpl_UpsampleBy2
                    ((int16_t *)lengthIn_local,(size_t)samplesOut_local,(int16_t *)maxLen_local,
                     (int32_t *)this->state1_);
          for (i_11 = 0; i_11 < (ulong)((long)samplesOut_local << 1); i_11 = i_11 + 0xdc) {
            WebRtcSpl_Resample22khzTo16khz
                      ((int16_t *)(maxLen_local + i_11 * 2),piVar2 + (i_11 / 0xdc) * 0xa0,
                       (WebRtcSpl_State22khzTo16khz *)this->state2_,piVar3);
          }
          WebRtcSpl_UpsampleBy2
                    (piVar2,(ulong)((long)samplesOut_local << 4) / 0xb,(int16_t *)maxLen_local,
                     (int32_t *)this->state3_);
          *(ulong *)left = (ulong)((long)samplesOut_local << 5) / 0xb;
          free(piVar3);
          free(piVar2);
          this_local._4_4_ = 0;
        }
      }
      else {
        this_local._4_4_ = -1;
      }
      break;
    case kResamplerMode2To1:
      if (maxLen < lengthIn >> 1) {
        this_local._4_4_ = -1;
      }
      else {
        WebRtcSpl_DownsampleBy2(samplesIn,lengthIn,samplesOut,(int32_t *)this->state1_);
        *(ulong *)left = (ulong)samplesOut_local >> 1;
        this_local._4_4_ = 0;
      }
      break;
    case kResamplerMode3To1:
      if (lengthIn % 0x1e0 == 0) {
        if (maxLen < lengthIn / 3) {
          this_local._4_4_ = -1;
        }
        else {
          piVar3 = (int32_t *)malloc(0x7c0);
          for (i_12 = 0; i_12 < samplesOut_local; i_12 = i_12 + 0x1e0) {
            WebRtcSpl_Resample48khzTo16khz
                      ((int16_t *)(lengthIn_local + i_12 * 2),
                       (int16_t *)(maxLen_local + (i_12 / 3) * 2),
                       (WebRtcSpl_State48khzTo16khz *)this->state1_,piVar3);
          }
          *(ulong *)left = (ulong)samplesOut_local / 3;
          free(piVar3);
          this_local._4_4_ = 0;
        }
      }
      else {
        this_local._4_4_ = -1;
      }
      break;
    case kResamplerMode4To1:
      if (maxLen < lengthIn >> 2) {
        this_local._4_4_ = -1;
      }
      else {
        piVar2 = (int16_t *)malloc(lengthIn & 0x7fffffffffffffff);
        WebRtcSpl_DownsampleBy2
                  ((int16_t *)lengthIn_local,(size_t)samplesOut_local,piVar2,
                   (int32_t *)this->state1_);
        WebRtcSpl_DownsampleBy2
                  (piVar2,(ulong)samplesOut_local >> 1,(int16_t *)maxLen_local,
                   (int32_t *)this->state2_);
        *(ulong *)left = (ulong)samplesOut_local >> 2;
        free(piVar2);
        this_local._4_4_ = 0;
      }
      break;
    case kResamplerMode6To1:
      if (lengthIn % 0x1e0 == 0) {
        if (maxLen < lengthIn / 6) {
          this_local._4_4_ = -1;
        }
        else {
          piVar3 = (int32_t *)malloc(0x7c0);
          piVar2 = (int16_t *)malloc((ulong)((long)samplesOut_local << 1) / 3);
          for (i_13 = 0; i_13 < samplesOut_local; i_13 = i_13 + 0x1e0) {
            WebRtcSpl_Resample48khzTo16khz
                      ((int16_t *)(lengthIn_local + i_13 * 2),piVar2 + i_13 / 3,
                       (WebRtcSpl_State48khzTo16khz *)this->state1_,piVar3);
          }
          *(ulong *)left = (ulong)samplesOut_local / 3;
          free(piVar3);
          WebRtcSpl_DownsampleBy2
                    (piVar2,*(size_t *)left,(int16_t *)maxLen_local,(int32_t *)this->state2_);
          free(piVar2);
          *(ulong *)left = *(ulong *)left >> 1;
          this_local._4_4_ = 0;
        }
      }
      else {
        this_local._4_4_ = -1;
      }
      break;
    case kResamplerMode12To1:
      if (lengthIn % 0x1e0 == 0) {
        if (maxLen < lengthIn / 0xc) {
          this_local._4_4_ = -1;
        }
        else {
          piVar3 = (int32_t *)malloc(0x7c0);
          piVar2 = (int16_t *)malloc((ulong)((long)samplesOut_local << 1) / 3);
          out = (int16_t *)malloc((ulong)((long)samplesOut_local << 1) / 6);
          for (i_14 = 0; i_14 < samplesOut_local; i_14 = i_14 + 0x1e0) {
            WebRtcSpl_Resample48khzTo16khz
                      ((int16_t *)(lengthIn_local + i_14 * 2),piVar2 + i_14 / 3,
                       (WebRtcSpl_State48khzTo16khz *)this->state1_,piVar3);
          }
          *(ulong *)left = (ulong)samplesOut_local / 3;
          free(piVar3);
          WebRtcSpl_DownsampleBy2(piVar2,*(size_t *)left,out,(int32_t *)this->state2_);
          *(ulong *)left = *(ulong *)left >> 1;
          free(piVar2);
          WebRtcSpl_DownsampleBy2
                    (out,*(size_t *)left,(int16_t *)maxLen_local,(int32_t *)this->state3_);
          free(out);
          *(ulong *)left = *(ulong *)left >> 1;
          this_local._4_4_ = 0;
        }
      }
      else {
        this_local._4_4_ = -1;
      }
      break;
    case kResamplerMode3To2:
      if (maxLen < (lengthIn << 1) / 3) {
        this_local._4_4_ = -1;
      }
      else {
        piVar2 = (int16_t *)malloc(lengthIn << 2);
        WebRtcSpl_UpsampleBy2
                  ((int16_t *)lengthIn_local,(size_t)samplesOut_local,piVar2,
                   (int32_t *)this->state1_);
        samplesOut_local = (int16_t *)((long)samplesOut_local << 1);
        if ((ulong)samplesOut_local % 0x1e0 == 0) {
          piVar3 = (int32_t *)malloc(0x7c0);
          for (i_15 = 0; i_15 < samplesOut_local; i_15 = i_15 + 0x1e0) {
            WebRtcSpl_Resample48khzTo16khz
                      (piVar2 + i_15,(int16_t *)(maxLen_local + (i_15 / 3) * 2),
                       (WebRtcSpl_State48khzTo16khz *)this->state2_,piVar3);
          }
          *(ulong *)left = (ulong)samplesOut_local / 3;
          free(piVar2);
          free(piVar3);
          this_local._4_4_ = 0;
        }
        else {
          free(piVar2);
          this_local._4_4_ = -1;
        }
      }
      break;
    case kResamplerMode11To2:
      if (lengthIn % 0xdc == 0) {
        if (maxLen < (lengthIn << 1) / 0xb) {
          this_local._4_4_ = -1;
        }
        else {
          piVar3 = (int32_t *)malloc(0x1f8);
          piVar2 = (int16_t *)malloc((ulong)((long)samplesOut_local << 2) / 0xb << 1);
          for (i_16 = 0; i_16 < samplesOut_local; i_16 = i_16 + 0xdc) {
            WebRtcSpl_Resample22khzTo8khz
                      ((int16_t *)(lengthIn_local + i_16 * 2),piVar2 + (i_16 << 2) / 0xb,
                       (WebRtcSpl_State22khzTo8khz *)this->state1_,piVar3);
          }
          samplesOut_local = (int16_t *)((ulong)((long)samplesOut_local << 2) / 0xb);
          WebRtcSpl_DownsampleBy2
                    (piVar2,(size_t)samplesOut_local,(int16_t *)maxLen_local,
                     (int32_t *)this->state2_);
          *(ulong *)left = (ulong)samplesOut_local >> 1;
          free(piVar3);
          free(piVar2);
          this_local._4_4_ = 0;
        }
      }
      else {
        this_local._4_4_ = -1;
      }
      break;
    case kResamplerMode11To4:
      if (lengthIn % 0xdc == 0) {
        if (maxLen < (lengthIn << 2) / 0xb) {
          this_local._4_4_ = -1;
        }
        else {
          piVar3 = (int32_t *)malloc(0x1f8);
          for (i_17 = 0; i_17 < samplesOut_local; i_17 = i_17 + 0xdc) {
            WebRtcSpl_Resample22khzTo8khz
                      ((int16_t *)(lengthIn_local + i_17 * 2),
                       (int16_t *)(maxLen_local + ((i_17 << 2) / 0xb) * 2),
                       (WebRtcSpl_State22khzTo8khz *)this->state1_,piVar3);
          }
          *(ulong *)left = (ulong)((long)samplesOut_local << 2) / 0xb;
          free(piVar3);
          this_local._4_4_ = 0;
        }
      }
      else {
        this_local._4_4_ = -1;
      }
      break;
    case kResamplerMode11To8:
      if (lengthIn % 0xdc == 0) {
        if (maxLen < (lengthIn << 3) / 0xb) {
          this_local._4_4_ = -1;
        }
        else {
          piVar3 = (int32_t *)malloc(0x1a0);
          for (local_120 = (int16_t *)0x0; local_120 < samplesOut_local;
              local_120 = local_120 + 0x6e) {
            WebRtcSpl_Resample22khzTo16khz
                      ((int16_t *)(lengthIn_local + (long)local_120 * 2),
                       (int16_t *)(maxLen_local + ((ulong)((long)local_120 << 3) / 0xb) * 2),
                       (WebRtcSpl_State22khzTo16khz *)this->state1_,piVar3);
          }
          *(ulong *)left = (ulong)((long)samplesOut_local << 3) / 0xb;
          free(piVar3);
          this_local._4_4_ = 0;
        }
      }
      else {
        this_local._4_4_ = -1;
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

int Resampler::Push(const int16_t * samplesIn, size_t lengthIn,
                    int16_t* samplesOut, size_t maxLen, size_t &outLen)
{
    if (num_channels_ == 2)
    {
        // Split up the signal and call the slave object for each channel
        int16_t* left = (int16_t*)malloc(lengthIn * sizeof(int16_t) / 2);
        int16_t* right = (int16_t*)malloc(lengthIn * sizeof(int16_t) / 2);
        int16_t* out_left = (int16_t*)malloc(maxLen / 2 * sizeof(int16_t));
        int16_t* out_right =
                (int16_t*)malloc(maxLen / 2 * sizeof(int16_t));
        int res = 0;
        for (size_t i = 0; i < lengthIn; i += 2)
        {
            left[i >> 1] = samplesIn[i];
            right[i >> 1] = samplesIn[i + 1];
        }

        // It's OK to overwrite the local parameter, since it's just a copy
        lengthIn = lengthIn / 2;

        size_t actualOutLen_left = 0;
        size_t actualOutLen_right = 0;
        // Do resampling for right channel
        res |= slave_left_->Push(left, lengthIn, out_left, maxLen / 2, actualOutLen_left);
        res |= slave_right_->Push(right, lengthIn, out_right, maxLen / 2, actualOutLen_right);
        if (res || (actualOutLen_left != actualOutLen_right))
        {
            free(left);
            free(right);
            free(out_left);
            free(out_right);
            return -1;
        }

        // Reassemble the signal
        for (size_t i = 0; i < actualOutLen_left; i++)
        {
            samplesOut[i * 2] = out_left[i];
            samplesOut[i * 2 + 1] = out_right[i];
        }
        outLen = 2 * actualOutLen_left;

        free(left);
        free(right);
        free(out_left);
        free(out_right);

        return 0;
    }

    // Containers for temp samples
    int16_t* tmp;
    int16_t* tmp_2;
    // tmp data for resampling routines
    int32_t* tmp_mem;

    switch (my_mode_)
    {
        case kResamplerMode1To1:
            memcpy(samplesOut, samplesIn, lengthIn * sizeof(int16_t));
            outLen = lengthIn;
            break;
        case kResamplerMode1To2:
            if (maxLen < (lengthIn * 2))
            {
                return -1;
            }
            WebRtcSpl_UpsampleBy2(samplesIn, lengthIn, samplesOut, (int32_t*)state1_);
            outLen = lengthIn * 2;
            return 0;
        case kResamplerMode1To3:

            // We can only handle blocks of 160 samples
            // Can be fixed, but I don't think it's needed
            if ((lengthIn % 160) != 0)
            {
                return -1;
            }
            if (maxLen < (lengthIn * 3))
            {
                return -1;
            }
            tmp_mem = (int32_t*)malloc(336 * sizeof(int32_t));

            for (size_t i = 0; i < lengthIn; i += 160)
            {
                WebRtcSpl_Resample16khzTo48khz(samplesIn + i, samplesOut + i * 3,
                                               (WebRtcSpl_State16khzTo48khz *)state1_,
                                               tmp_mem);
            }
            outLen = lengthIn * 3;
            free(tmp_mem);
            return 0;
        case kResamplerMode1To4:
            if (maxLen < (lengthIn * 4))
            {
                return -1;
            }

            tmp = (int16_t*)malloc(sizeof(int16_t) * 2 * lengthIn);
            // 1:2
            WebRtcSpl_UpsampleBy2(samplesIn, lengthIn, tmp, (int32_t*)state1_);
            // 2:4
            WebRtcSpl_UpsampleBy2(tmp, lengthIn * 2, samplesOut, (int32_t*)state2_);
            outLen = lengthIn * 4;
            free(tmp);
            return 0;
        case kResamplerMode1To6:
            // We can only handle blocks of 80 samples
            // Can be fixed, but I don't think it's needed
            if ((lengthIn % 80) != 0)
            {
                return -1;
            }
            if (maxLen < (lengthIn * 6))
            {
                return -1;
            }

            //1:2

            tmp_mem = (int32_t*)malloc(336 * sizeof(int32_t));
            tmp = (int16_t*)malloc(sizeof(int16_t) * 2 * lengthIn);

            WebRtcSpl_UpsampleBy2(samplesIn, lengthIn, tmp, (int32_t*)state1_);
            outLen = lengthIn * 2;

            for (size_t i = 0; i < outLen; i += 160)
            {
                WebRtcSpl_Resample16khzTo48khz(tmp + i, samplesOut + i * 3,
                                               (WebRtcSpl_State16khzTo48khz *)state2_,
                                               tmp_mem);
            }
            outLen = outLen * 3;
            free(tmp_mem);
            free(tmp);

            return 0;
        case kResamplerMode1To12:
            // We can only handle blocks of 40 samples
            // Can be fixed, but I don't think it's needed
            if ((lengthIn % 40) != 0) {
              return -1;
            }
            if (maxLen < (lengthIn * 12)) {
              return -1;
            }

            tmp_mem = (int32_t*) malloc(336 * sizeof(int32_t));
            tmp = (int16_t*) malloc(sizeof(int16_t) * 4 * lengthIn);
            //1:2
            WebRtcSpl_UpsampleBy2(samplesIn, lengthIn, samplesOut,
                                  (int32_t*) state1_);
            outLen = lengthIn * 2;
            //2:4
            WebRtcSpl_UpsampleBy2(samplesOut, outLen, tmp, (int32_t*) state2_);
            outLen = outLen * 2;
            // 4:12
            for (size_t i = 0; i < outLen; i += 160) {
              // WebRtcSpl_Resample16khzTo48khz() takes a block of 160 samples
              // as input and outputs a resampled block of 480 samples. The
              // data is now actually in 32 kHz sampling rate, despite the
              // function name, and with a resampling factor of three becomes
              // 96 kHz.
              WebRtcSpl_Resample16khzTo48khz(tmp + i, samplesOut + i * 3,
                                             (WebRtcSpl_State16khzTo48khz*) state3_,
                                             tmp_mem);
            }
            outLen = outLen * 3;
            free(tmp_mem);
            free(tmp);

            return 0;
        case kResamplerMode2To3:
            if (maxLen < (lengthIn * 3 / 2))
            {
                return -1;
            }
            // 2:6
            // We can only handle blocks of 160 samples
            // Can be fixed, but I don't think it's needed
            if ((lengthIn % 160) != 0)
            {
                return -1;
            }
            tmp = static_cast<int16_t*> (malloc(sizeof(int16_t) * lengthIn * 3));
            tmp_mem = (int32_t*)malloc(336 * sizeof(int32_t));
            for (size_t i = 0; i < lengthIn; i += 160)
            {
                WebRtcSpl_Resample16khzTo48khz(samplesIn + i, tmp + i * 3,
                                               (WebRtcSpl_State16khzTo48khz *)state1_,
                                               tmp_mem);
            }
            lengthIn = lengthIn * 3;
            // 6:3
            WebRtcSpl_DownsampleBy2(tmp, lengthIn, samplesOut, (int32_t*)state2_);
            outLen = lengthIn / 2;
            free(tmp);
            free(tmp_mem);
            return 0;
        case kResamplerMode2To11:

            // We can only handle blocks of 80 samples
            // Can be fixed, but I don't think it's needed
            if ((lengthIn % 80) != 0)
            {
                return -1;
            }
            if (maxLen < ((lengthIn * 11) / 2))
            {
                return -1;
            }
            tmp = (int16_t*)malloc(sizeof(int16_t) * 2 * lengthIn);
            // 1:2
            WebRtcSpl_UpsampleBy2(samplesIn, lengthIn, tmp, (int32_t*)state1_);
            lengthIn *= 2;

            tmp_mem = (int32_t*)malloc(98 * sizeof(int32_t));

            for (size_t i = 0; i < lengthIn; i += 80)
            {
                WebRtcSpl_Resample8khzTo22khz(tmp + i, samplesOut + (i * 11) / 4,
                                              (WebRtcSpl_State8khzTo22khz *)state2_,
                                              tmp_mem);
            }
            outLen = (lengthIn * 11) / 4;
            free(tmp_mem);
            free(tmp);
            return 0;
        case kResamplerMode4To11:

            // We can only handle blocks of 80 samples
            // Can be fixed, but I don't think it's needed
            if ((lengthIn % 80) != 0)
            {
                return -1;
            }
            if (maxLen < ((lengthIn * 11) / 4))
            {
                return -1;
            }
            tmp_mem = (int32_t*)malloc(98 * sizeof(int32_t));

            for (size_t i = 0; i < lengthIn; i += 80)
            {
                WebRtcSpl_Resample8khzTo22khz(samplesIn + i, samplesOut + (i * 11) / 4,
                                              (WebRtcSpl_State8khzTo22khz *)state1_,
                                              tmp_mem);
            }
            outLen = (lengthIn * 11) / 4;
            free(tmp_mem);
            return 0;
        case kResamplerMode8To11:
            // We can only handle blocks of 160 samples
            // Can be fixed, but I don't think it's needed
            if ((lengthIn % 160) != 0)
            {
                return -1;
            }
            if (maxLen < ((lengthIn * 11) / 8))
            {
                return -1;
            }
            tmp_mem = (int32_t*)malloc(88 * sizeof(int32_t));

            for (size_t i = 0; i < lengthIn; i += 160)
            {
                WebRtcSpl_Resample16khzTo22khz(samplesIn + i, samplesOut + (i * 11) / 8,
                                               (WebRtcSpl_State16khzTo22khz *)state1_,
                                               tmp_mem);
            }
            outLen = (lengthIn * 11) / 8;
            free(tmp_mem);
            return 0;

        case kResamplerMode11To16:
            // We can only handle blocks of 110 samples
            if ((lengthIn % 110) != 0)
            {
                return -1;
            }
            if (maxLen < ((lengthIn * 16) / 11))
            {
                return -1;
            }

            tmp_mem = (int32_t*)malloc(104 * sizeof(int32_t));
            tmp = (int16_t*)malloc((sizeof(int16_t) * lengthIn * 2));

            WebRtcSpl_UpsampleBy2(samplesIn, lengthIn, tmp, (int32_t*)state1_);

            for (size_t i = 0; i < (lengthIn * 2); i += 220)
            {
                WebRtcSpl_Resample22khzTo16khz(tmp + i, samplesOut + (i / 220) * 160,
                                               (WebRtcSpl_State22khzTo16khz *)state2_,
                                               tmp_mem);
            }

            outLen = (lengthIn * 16) / 11;

            free(tmp_mem);
            free(tmp);
            return 0;

        case kResamplerMode11To32:

            // We can only handle blocks of 110 samples
            if ((lengthIn % 110) != 0)
            {
                return -1;
            }
            if (maxLen < ((lengthIn * 32) / 11))
            {
                return -1;
            }

            tmp_mem = (int32_t*)malloc(104 * sizeof(int32_t));
            tmp = (int16_t*)malloc((sizeof(int16_t) * lengthIn * 2));

            // 11 -> 22 kHz in samplesOut
            WebRtcSpl_UpsampleBy2(samplesIn, lengthIn, samplesOut, (int32_t*)state1_);

            // 22 -> 16 in tmp
            for (size_t i = 0; i < (lengthIn * 2); i += 220)
            {
                WebRtcSpl_Resample22khzTo16khz(samplesOut + i, tmp + (i / 220) * 160,
                                               (WebRtcSpl_State22khzTo16khz *)state2_,
                                               tmp_mem);
            }

            // 16 -> 32 in samplesOut
            WebRtcSpl_UpsampleBy2(tmp, (lengthIn * 16) / 11, samplesOut,
                                  (int32_t*)state3_);

            outLen = (lengthIn * 32) / 11;

            free(tmp_mem);
            free(tmp);
            return 0;

        case kResamplerMode2To1:
            if (maxLen < (lengthIn / 2))
            {
                return -1;
            }
            WebRtcSpl_DownsampleBy2(samplesIn, lengthIn, samplesOut, (int32_t*)state1_);
            outLen = lengthIn / 2;
            return 0;
        case kResamplerMode3To1:
            // We can only handle blocks of 480 samples
            // Can be fixed, but I don't think it's needed
            if ((lengthIn % 480) != 0)
            {
                return -1;
            }
            if (maxLen < (lengthIn / 3))
            {
                return -1;
            }
            tmp_mem = (int32_t*)malloc(496 * sizeof(int32_t));

            for (size_t i = 0; i < lengthIn; i += 480)
            {
                WebRtcSpl_Resample48khzTo16khz(samplesIn + i, samplesOut + i / 3,
                                               (WebRtcSpl_State48khzTo16khz *)state1_,
                                               tmp_mem);
            }
            outLen = lengthIn / 3;
            free(tmp_mem);
            return 0;
        case kResamplerMode4To1:
            if (maxLen < (lengthIn / 4))
            {
                return -1;
            }
            tmp = (int16_t*)malloc(sizeof(int16_t) * lengthIn / 2);
            // 4:2
            WebRtcSpl_DownsampleBy2(samplesIn, lengthIn, tmp, (int32_t*)state1_);
            // 2:1
            WebRtcSpl_DownsampleBy2(tmp, lengthIn / 2, samplesOut, (int32_t*)state2_);
            outLen = lengthIn / 4;
            free(tmp);
            return 0;

        case kResamplerMode6To1:
            // We can only handle blocks of 480 samples
            // Can be fixed, but I don't think it's needed
            if ((lengthIn % 480) != 0)
            {
                return -1;
            }
            if (maxLen < (lengthIn / 6))
            {
                return -1;
            }

            tmp_mem = (int32_t*)malloc(496 * sizeof(int32_t));
            tmp = (int16_t*)malloc((sizeof(int16_t) * lengthIn) / 3);

            for (size_t i = 0; i < lengthIn; i += 480)
            {
                WebRtcSpl_Resample48khzTo16khz(samplesIn + i, tmp + i / 3,
                                               (WebRtcSpl_State48khzTo16khz *)state1_,
                                               tmp_mem);
            }
            outLen = lengthIn / 3;
            free(tmp_mem);
            WebRtcSpl_DownsampleBy2(tmp, outLen, samplesOut, (int32_t*)state2_);
            free(tmp);
            outLen = outLen / 2;
            return 0;
        case kResamplerMode12To1:
            // We can only handle blocks of 480 samples
            // Can be fixed, but I don't think it's needed
            if ((lengthIn % 480) != 0) {
              return -1;
            }
            if (maxLen < (lengthIn / 12)) {
              return -1;
            }

            tmp_mem = (int32_t*) malloc(496 * sizeof(int32_t));
            tmp = (int16_t*) malloc((sizeof(int16_t) * lengthIn) / 3);
            tmp_2 = (int16_t*) malloc((sizeof(int16_t) * lengthIn) / 6);
            // 12:4
            for (size_t i = 0; i < lengthIn; i += 480) {
              // WebRtcSpl_Resample48khzTo16khz() takes a block of 480 samples
              // as input and outputs a resampled block of 160 samples. The
              // data is now actually in 96 kHz sampling rate, despite the
              // function name, and with a resampling factor of 1/3 becomes
              // 32 kHz.
              WebRtcSpl_Resample48khzTo16khz(samplesIn + i, tmp + i / 3,
                                             (WebRtcSpl_State48khzTo16khz*) state1_,
                                             tmp_mem);
            }
            outLen = lengthIn / 3;
            free(tmp_mem);
            // 4:2
            WebRtcSpl_DownsampleBy2(tmp, outLen, tmp_2, (int32_t*) state2_);
            outLen = outLen / 2;
            free(tmp);
            // 2:1
            WebRtcSpl_DownsampleBy2(tmp_2, outLen, samplesOut,
                                    (int32_t*) state3_);
            free(tmp_2);
            outLen = outLen / 2;
            return 0;
        case kResamplerMode3To2:
            if (maxLen < (lengthIn * 2 / 3))
            {
                return -1;
            }
            // 3:6
            tmp = static_cast<int16_t*> (malloc(sizeof(int16_t) * lengthIn * 2));
            WebRtcSpl_UpsampleBy2(samplesIn, lengthIn, tmp, (int32_t*)state1_);
            lengthIn *= 2;
            // 6:2
            // We can only handle blocks of 480 samples
            // Can be fixed, but I don't think it's needed
            if ((lengthIn % 480) != 0)
            {
                free(tmp);
                return -1;
            }
            tmp_mem = (int32_t*)malloc(496 * sizeof(int32_t));
            for (size_t i = 0; i < lengthIn; i += 480)
            {
                WebRtcSpl_Resample48khzTo16khz(tmp + i, samplesOut + i / 3,
                                               (WebRtcSpl_State48khzTo16khz *)state2_,
                                               tmp_mem);
            }
            outLen = lengthIn / 3;
            free(tmp);
            free(tmp_mem);
            return 0;
        case kResamplerMode11To2:
            // We can only handle blocks of 220 samples
            // Can be fixed, but I don't think it's needed
            if ((lengthIn % 220) != 0)
            {
                return -1;
            }
            if (maxLen < ((lengthIn * 2) / 11))
            {
                return -1;
            }
            tmp_mem = (int32_t*)malloc(126 * sizeof(int32_t));
            tmp = (int16_t*)malloc((lengthIn * 4) / 11 * sizeof(int16_t));

            for (size_t i = 0; i < lengthIn; i += 220)
            {
                WebRtcSpl_Resample22khzTo8khz(samplesIn + i, tmp + (i * 4) / 11,
                                              (WebRtcSpl_State22khzTo8khz *)state1_,
                                              tmp_mem);
            }
            lengthIn = (lengthIn * 4) / 11;

            WebRtcSpl_DownsampleBy2(tmp, lengthIn, samplesOut,
                                    (int32_t*)state2_);
            outLen = lengthIn / 2;

            free(tmp_mem);
            free(tmp);
            return 0;
        case kResamplerMode11To4:
            // We can only handle blocks of 220 samples
            // Can be fixed, but I don't think it's needed
            if ((lengthIn % 220) != 0)
            {
                return -1;
            }
            if (maxLen < ((lengthIn * 4) / 11))
            {
                return -1;
            }
            tmp_mem = (int32_t*)malloc(126 * sizeof(int32_t));

            for (size_t i = 0; i < lengthIn; i += 220)
            {
                WebRtcSpl_Resample22khzTo8khz(samplesIn + i, samplesOut + (i * 4) / 11,
                                              (WebRtcSpl_State22khzTo8khz *)state1_,
                                              tmp_mem);
            }
            outLen = (lengthIn * 4) / 11;
            free(tmp_mem);
            return 0;
        case kResamplerMode11To8:
            // We can only handle blocks of 160 samples
            // Can be fixed, but I don't think it's needed
            if ((lengthIn % 220) != 0)
            {
                return -1;
            }
            if (maxLen < ((lengthIn * 8) / 11))
            {
                return -1;
            }
            tmp_mem = (int32_t*)malloc(104 * sizeof(int32_t));

            for (size_t i = 0; i < lengthIn; i += 220)
            {
                WebRtcSpl_Resample22khzTo16khz(samplesIn + i, samplesOut + (i * 8) / 11,
                                               (WebRtcSpl_State22khzTo16khz *)state1_,
                                               tmp_mem);
            }
            outLen = (lengthIn * 8) / 11;
            free(tmp_mem);
            return 0;
            break;

    }
    return 0;
}